

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

InputMap * Omega_h::read_input_without_includes(InputMap *__return_storage_ptr__,path *path)

{
  char cVar1;
  value_type *pvVar2;
  InputMap *other;
  storage_union sStack_3e8;
  long local_3d8;
  string local_3d0;
  InputYamlReader reader;
  ifstream stream;
  
  pvVar2 = filesystem::path::c_str(path);
  std::ifstream::ifstream(&stream,pvVar2,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    InputYamlReader::InputYamlReader(&reader);
    filesystem::path::string_abi_cxx11_(&local_3d0,path);
    Reader::read_stream((any *)&sStack_3e8,&reader.super_Reader,(istream *)&stream,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    other = any_cast<Omega_h::InputMap&&>((any *)&sStack_3e8);
    InputMap::InputMap(__return_storage_ptr__,other);
    if (local_3d8 != 0) {
      (**(code **)(local_3d8 + 8))(&sStack_3e8);
    }
    InputYamlReader::~InputYamlReader(&reader);
    std::ifstream::~ifstream(&stream);
    return __return_storage_ptr__;
  }
  pvVar2 = filesystem::path::c_str(path);
  fail("Couldn\'t open Input file \"%s\"\n",pvVar2);
}

Assistant:

static InputMap read_input_without_includes(
    Omega_h::filesystem::path const& path) {
  std::ifstream stream(path.c_str());
  if (!stream.is_open()) {
    Omega_h_fail("Couldn't open Input file \"%s\"\n", path.c_str());
  }
  Omega_h::InputYamlReader reader;
  auto result_any = reader.read_stream(stream, path.string());
  return any_cast<InputMap&&>(std::move(result_any));
}